

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5Init(sqlite3 *db)

{
  Fts5Global *pGlobal_00;
  void *p;
  Fts5Global *pGlobal;
  int rc;
  sqlite3 *db_local;
  
  pGlobal_00 = (Fts5Global *)sqlite3_malloc(0x50);
  if (pGlobal_00 == (Fts5Global *)0x0) {
    pGlobal._4_4_ = 7;
  }
  else {
    memset(pGlobal_00,0,0x50);
    pGlobal_00->db = db;
    (pGlobal_00->api).iVersion = 2;
    (pGlobal_00->api).xCreateFunction = fts5CreateAux;
    (pGlobal_00->api).xCreateTokenizer = fts5CreateTokenizer;
    (pGlobal_00->api).xFindTokenizer = fts5FindTokenizer;
    pGlobal._4_4_ =
         sqlite3_create_module_v2(db,"fts5",&fts5Init::fts5Mod,pGlobal_00,fts5ModuleDestroy);
    if (pGlobal._4_4_ == 0) {
      pGlobal._4_4_ = sqlite3Fts5IndexInit(db);
    }
    if (pGlobal._4_4_ == 0) {
      pGlobal._4_4_ = sqlite3Fts5ExprInit(pGlobal_00,db);
    }
    if (pGlobal._4_4_ == 0) {
      pGlobal._4_4_ = sqlite3Fts5AuxInit((fts5_api *)pGlobal_00);
    }
    if (pGlobal._4_4_ == 0) {
      pGlobal._4_4_ = sqlite3Fts5TokenizerInit((fts5_api *)pGlobal_00);
    }
    if (pGlobal._4_4_ == 0) {
      pGlobal._4_4_ = sqlite3Fts5VocabInit(pGlobal_00,db);
    }
    if (pGlobal._4_4_ == 0) {
      pGlobal._4_4_ =
           sqlite3_create_function
                     (db,"fts5",1,1,pGlobal_00,fts5Fts5Func,
                      (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0,
                      (_func_void_sqlite3_context_ptr *)0x0);
    }
    if (pGlobal._4_4_ == 0) {
      pGlobal._4_4_ =
           sqlite3_create_function
                     (db,"fts5_source_id",0,1,pGlobal_00,fts5SourceIdFunc,
                      (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0,
                      (_func_void_sqlite3_context_ptr *)0x0);
    }
  }
  return pGlobal._4_4_;
}

Assistant:

static int fts5Init(sqlite3 *db){
  static const sqlite3_module fts5Mod = {
    /* iVersion      */ 3,
    /* xCreate       */ fts5CreateMethod,
    /* xConnect      */ fts5ConnectMethod,
    /* xBestIndex    */ fts5BestIndexMethod,
    /* xDisconnect   */ fts5DisconnectMethod,
    /* xDestroy      */ fts5DestroyMethod,
    /* xOpen         */ fts5OpenMethod,
    /* xClose        */ fts5CloseMethod,
    /* xFilter       */ fts5FilterMethod,
    /* xNext         */ fts5NextMethod,
    /* xEof          */ fts5EofMethod,
    /* xColumn       */ fts5ColumnMethod,
    /* xRowid        */ fts5RowidMethod,
    /* xUpdate       */ fts5UpdateMethod,
    /* xBegin        */ fts5BeginMethod,
    /* xSync         */ fts5SyncMethod,
    /* xCommit       */ fts5CommitMethod,
    /* xRollback     */ fts5RollbackMethod,
    /* xFindFunction */ fts5FindFunctionMethod,
    /* xRename       */ fts5RenameMethod,
    /* xSavepoint    */ fts5SavepointMethod,
    /* xRelease      */ fts5ReleaseMethod,
    /* xRollbackTo   */ fts5RollbackToMethod,
    /* xShadowName   */ fts5ShadowName
  };

  int rc;
  Fts5Global *pGlobal = 0;

  pGlobal = (Fts5Global*)sqlite3_malloc(sizeof(Fts5Global));
  if( pGlobal==0 ){
    rc = SQLITE_NOMEM;
  }else{
    void *p = (void*)pGlobal;
    memset(pGlobal, 0, sizeof(Fts5Global));
    pGlobal->db = db;
    pGlobal->api.iVersion = 2;
    pGlobal->api.xCreateFunction = fts5CreateAux;
    pGlobal->api.xCreateTokenizer = fts5CreateTokenizer;
    pGlobal->api.xFindTokenizer = fts5FindTokenizer;
    rc = sqlite3_create_module_v2(db, "fts5", &fts5Mod, p, fts5ModuleDestroy);
    if( rc==SQLITE_OK ) rc = sqlite3Fts5IndexInit(db);
    if( rc==SQLITE_OK ) rc = sqlite3Fts5ExprInit(pGlobal, db);
    if( rc==SQLITE_OK ) rc = sqlite3Fts5AuxInit(&pGlobal->api);
    if( rc==SQLITE_OK ) rc = sqlite3Fts5TokenizerInit(&pGlobal->api);
    if( rc==SQLITE_OK ) rc = sqlite3Fts5VocabInit(pGlobal, db);
    if( rc==SQLITE_OK ){
      rc = sqlite3_create_function(
          db, "fts5", 1, SQLITE_UTF8, p, fts5Fts5Func, 0, 0
      );
    }
    if( rc==SQLITE_OK ){
      rc = sqlite3_create_function(
          db, "fts5_source_id", 0, SQLITE_UTF8, p, fts5SourceIdFunc, 0, 0
      );
    }
  }

  /* If SQLITE_FTS5_ENABLE_TEST_MI is defined, assume that the file
  ** fts5_test_mi.c is compiled and linked into the executable. And call
  ** its entry point to enable the matchinfo() demo.  */
#ifdef SQLITE_FTS5_ENABLE_TEST_MI
  if( rc==SQLITE_OK ){
    extern int sqlite3Fts5TestRegisterMatchinfo(sqlite3*);
    rc = sqlite3Fts5TestRegisterMatchinfo(db);
  }
#endif

  return rc;
}